

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-optimizer.hxx
# Opt level: O1

size_t __thiscall
lineage::heuristics::
PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
::improveBipartition
          (PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
           *this,size_t partitionIdA,size_t partitionIdB)

{
  ulong *puVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  pointer pRVar4;
  pointer pAVar5;
  _Bit_type *p_Var6;
  double v_00;
  unsigned_long uVar7;
  pointer puVar8;
  ulong uVar9;
  pointer puVar10;
  byte bVar11;
  __node_base _Var12;
  ostream *poVar13;
  runtime_error *this_00;
  pointer pAVar14;
  long lVar15;
  double dVar16;
  _Hash_node_base *p_Var17;
  _Hash_node_base *p_Var18;
  ulong uVar19;
  undefined8 *puVar20;
  double v_01;
  double dVar21;
  _Hash_node_base *p_Var22;
  ulong uVar23;
  iterator iVar24;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var25;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var26;
  unsigned_long *v_1;
  pair<unsigned_long,_unsigned_long> *ppVar27;
  _Hash_node_base *p_Var28;
  bool bVar29;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double dVar30;
  double dVar31;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  move_edges;
  value_type *__range3;
  __alloc_node_gen_t __alloc_node_gen;
  vector<unsigned_long,_std::allocator<unsigned_long>_> buffer;
  size_t previousPartition;
  unsigned_long v;
  pair<unsigned_long,_unsigned_long> *local_1e8;
  iterator iStack_1e0;
  pair<unsigned_long,_unsigned_long> *local_1d8;
  double local_1c8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_1c0;
  PartitionGraph *local_1b8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_1b0;
  ulong local_1a8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_1a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_168;
  ulong local_148;
  _Prime_rehash_policy *local_140;
  _Prime_rehash_policy *local_138;
  double local_130;
  double local_128;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_120;
  undefined8 local_e8;
  size_type local_e0;
  undefined8 local_d8;
  size_type local_d0;
  undefined8 local_c8;
  size_t sStack_c0;
  undefined8 local_b8;
  size_t local_b0;
  size_t local_a8;
  double local_a0;
  double local_98;
  double local_90;
  unsigned_long local_88;
  ulong local_80;
  pair<unsigned_long,_unsigned_long> *local_78;
  double local_70;
  _AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_> local_68;
  ulong local_60;
  double local_58;
  double local_50;
  double local_48;
  double dStack_40;
  
  (*(this->super_HeuristicBase)._vptr_HeuristicBase[2])();
  local_48 = this->internalObjective_;
  dStack_40 = this->branchingObjective_;
  local_1c0 = &((this->partitionGraph_).partitions_.
                super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_h;
  local_1c8 = (double)(partitionIdA * 0x38);
  local_1e8 = (pair<unsigned_long,_unsigned_long> *)0x0;
  iStack_1e0._M_current = (pair<unsigned_long,_unsigned_long> *)0x0;
  local_1d8 = (pair<unsigned_long,_unsigned_long> *)0x0;
  p_Var26 = local_1c0 + partitionIdB;
  local_a8 = partitionIdA;
  local_b0 = partitionIdB;
  local_a0 = extraout_XMM0_Qa;
  for (p_Var28 = local_1c0[partitionIdA]._M_before_begin._M_nxt; local_1b0 = p_Var26,
      p_Var28 != (_Hash_node_base *)0x0; p_Var28 = p_Var28->_M_nxt) {
    p_Var17 = (p_Var26->_M_before_begin)._M_nxt;
    if (p_Var17 != (_Hash_node_base *)0x0) {
      p_Var2 = p_Var28[1]._M_nxt;
      do {
        p_Var3 = p_Var17[1]._M_nxt;
        pRVar4 = (((this->super_HeuristicBase).data_)->problemGraph->graph_).vertices_.
                 super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        p_Var18 = p_Var2;
        p_Var22 = p_Var3;
        if ((ulong)((long)pRVar4[(long)p_Var3].vector_.
                          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   *(long *)&pRVar4[(long)p_Var3].vector_) <
            (ulong)((long)pRVar4[(long)p_Var2].vector_.
                          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   *(long *)&pRVar4[(long)p_Var2].vector_)) {
          p_Var18 = p_Var3;
          p_Var22 = p_Var2;
        }
        pAVar14 = *(pointer *)&pRVar4[(long)p_Var18].vector_;
        pAVar5 = pRVar4[(long)p_Var18].vector_.
                 super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        uVar19 = (long)pAVar5 - (long)pAVar14 >> 4;
        while (uVar23 = uVar19, 0 < (long)uVar23) {
          uVar19 = uVar23 >> 1;
          if (*(_Hash_node_base **)(pAVar14 + uVar19) < p_Var22) {
            pAVar14 = pAVar14 + uVar19 + 1;
            uVar19 = ~uVar19 + uVar23;
          }
        }
        if ((pAVar5 != pAVar14) && ((_Hash_node_base *)pAVar14->vertex_ == p_Var22)) {
          if (iStack_1e0._M_current == local_1d8) {
            local_120._M_buckets = &p_Var2->_M_nxt;
            local_120._M_bucket_count = (size_type)p_Var3;
            std::
            vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
            ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                      ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                        *)&local_1e8,iStack_1e0,(pair<unsigned_long,_unsigned_long> *)&local_120);
          }
          else {
            (iStack_1e0._M_current)->first = (unsigned_long)p_Var2;
            (iStack_1e0._M_current)->second = (unsigned_long)p_Var3;
            iStack_1e0._M_current = iStack_1e0._M_current + 1;
          }
          local_120._M_buckets = &p_Var3->_M_nxt;
          local_120._M_bucket_count = (size_type)p_Var2;
          if (iStack_1e0._M_current == local_1d8) {
            std::
            vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
            ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                      ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                        *)&local_1e8,iStack_1e0,(pair<unsigned_long,_unsigned_long> *)&local_120);
          }
          else {
            (iStack_1e0._M_current)->first = (unsigned_long)p_Var3;
            (iStack_1e0._M_current)->second = (unsigned_long)p_Var2;
            iStack_1e0._M_current = iStack_1e0._M_current + 1;
          }
        }
        p_Var17 = p_Var17->_M_nxt;
      } while (p_Var17 != (_Hash_node_base *)0x0);
    }
    p_Var26 = local_1b0;
  }
  if (local_1e8 == iStack_1e0._M_current) {
    uVar19 = 0;
  }
  else {
    p_Var25 = (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)((long)&((_Hashtable *)&local_1c0->_M_buckets)->_M_buckets + (long)local_1c8);
    local_1a0._M_buckets = (__buckets_ptr)&local_120;
    local_120._M_buckets = (__buckets_ptr)0x0;
    local_120._M_bucket_count = p_Var25->_M_bucket_count;
    local_120._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_120._M_element_count = p_Var25->_M_element_count;
    local_120._M_rehash_policy._M_max_load_factor = (p_Var25->_M_rehash_policy)._M_max_load_factor;
    local_120._M_rehash_policy._4_4_ = *(undefined4 *)&(p_Var25->_M_rehash_policy).field_0x4;
    local_120._M_rehash_policy._M_next_resize = (p_Var25->_M_rehash_policy)._M_next_resize;
    local_120._M_single_bucket = (__node_base_ptr)0x0;
    std::
    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
              ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_1a0._M_buckets,p_Var25,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_> *)
               &local_1a0);
    local_1a0._M_buckets = (__buckets_ptr)&local_e8;
    local_e8 = 0;
    local_e0 = p_Var26->_M_bucket_count;
    local_d8 = 0;
    local_d0 = p_Var26->_M_element_count;
    local_c8 = *(undefined8 *)&p_Var26->_M_rehash_policy;
    sStack_c0 = (p_Var26->_M_rehash_policy)._M_next_resize;
    local_b8 = 0;
    std::
    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
              ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_1a0._M_buckets,p_Var26,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_> *)
               &local_1a0);
    local_1b8 = &this->partitionGraph_;
    local_138 = &p_Var25->_M_rehash_policy;
    local_140 = &p_Var26->_M_rehash_policy;
    p_Var6 = (this->swapped_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    lVar15 = 0;
    do {
      for (puVar20 = *(undefined8 **)((long)&local_120._M_before_begin._M_nxt + lVar15);
          puVar20 != (undefined8 *)0x0; puVar20 = (undefined8 *)*puVar20) {
        uVar19 = puVar20[1];
        uVar23 = uVar19 + 0x3f;
        if (-1 < (long)uVar19) {
          uVar23 = uVar19;
        }
        bVar11 = (byte)uVar19 & 0x3f;
        puVar1 = p_Var6 + ((long)uVar23 >> 6) +
                          (ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) +
                          0xffffffffffffffff;
        *puVar1 = *puVar1 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
      }
      lVar15 = lVar15 + 0x38;
    } while (lVar15 != 0x70);
    lVar15 = 0x38;
    do {
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)((long)&local_120._M_buckets + lVar15));
      lVar15 = lVar15 + -0x38;
    } while (lVar15 != -0x38);
    (*(this->super_HeuristicBase)._vptr_HeuristicBase[4])(this,local_a8,local_b0);
    this->localBranchingObjective_ = extraout_XMM0_Qa_00;
    local_60 = p_Var26->_M_element_count + p_Var25->_M_element_count >> 1;
    local_1a8 = 0;
    local_148 = 0;
    local_80 = 0;
    local_1c0 = p_Var25;
    do {
      local_120._M_buckets = (__buckets_ptr)0x0;
      local_120._M_bucket_count = local_1c0->_M_bucket_count;
      local_120._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_120._M_element_count = local_1c0->_M_element_count;
      local_120._M_rehash_policy._M_max_load_factor = local_138->_M_max_load_factor;
      local_120._M_rehash_policy._4_4_ = *(undefined4 *)&local_138->field_0x4;
      local_120._M_rehash_policy._M_next_resize = local_138->_M_next_resize;
      local_120._M_single_bucket = (__node_base_ptr)0x0;
      local_1a0._M_buckets = (__buckets_ptr)&local_120;
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_1a0._M_buckets,local_1c0,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_> *)
                 &local_1a0);
      local_e8 = 0;
      local_e0 = local_1b0->_M_bucket_count;
      local_d8 = 0;
      local_d0 = local_1b0->_M_element_count;
      local_c8 = *(undefined8 *)local_140;
      sStack_c0 = local_140->_M_next_resize;
      local_b8 = 0;
      local_1a0._M_buckets = (__buckets_ptr)&local_e8;
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_1a0._M_buckets,local_1b0,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_> *)
                 &local_1a0);
      p_Var6 = (this->visited_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      lVar15 = 0;
      do {
        for (puVar20 = *(undefined8 **)((long)&local_120._M_before_begin._M_nxt + lVar15);
            puVar20 != (undefined8 *)0x0; puVar20 = (undefined8 *)*puVar20) {
          uVar19 = puVar20[1];
          uVar23 = uVar19 + 0x3f;
          if (-1 < (long)uVar19) {
            uVar23 = uVar19;
          }
          bVar11 = (byte)uVar19 & 0x3f;
          puVar1 = p_Var6 + ((long)uVar23 >> 6) +
                            (ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) +
                            0xffffffffffffffff;
          *puVar1 = *puVar1 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
        }
        lVar15 = lVar15 + 0x38;
      } while (lVar15 != 0x70);
      lVar15 = 0x38;
      do {
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)((long)&local_120._M_buckets + lVar15));
        lVar15 = lVar15 + -0x38;
      } while (lVar15 != -0x38);
      if (local_1e8 == iStack_1e0._M_current) {
        local_88 = 0;
        local_98 = INFINITY;
        local_90 = INFINITY;
        dVar21 = INFINITY;
        v_01 = 0.0;
      }
      else {
        v_01 = 0.0;
        dVar21 = INFINITY;
        local_90 = INFINITY;
        local_98 = INFINITY;
        local_88 = 0;
        local_78 = iStack_1e0._M_current;
        iVar24._M_current = iStack_1e0._M_current;
        ppVar27 = local_1e8;
        do {
          v_00 = (double)ppVar27->first;
          uVar7 = ppVar27->second;
          puVar8 = (this->partitionGraph_).vertexLabels_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (puVar8[(long)v_00] == puVar8[uVar7]) {
            poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,"(",1);
            poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,")",1);
            std::endl<char,std::char_traits<char>>(poVar13);
            poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,"(",1);
            poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,")",1);
            std::endl<char,std::char_traits<char>>(poVar13);
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (this_00,"vertexLabels_ and partitions_ are inconsistent!");
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          dVar16 = (double)((long)v_00 + 0x3f);
          if (-1 < (long)v_00) {
            dVar16 = v_00;
          }
          lVar15 = (long)dVar16 >> 6;
          uVar19 = (ulong)(((ulong)v_00 & 0x800000000000003f) < 0x8000000000000001);
          uVar23 = 1L << (SUB81(v_00,0) & 0x3f);
          if (((this->swapped_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [lVar15 + uVar19 + 0xffffffffffffffff] >> ((ulong)v_00 & 0x3f) & 1) == 0) {
            p_Var6 = (this->visited_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            uVar9 = p_Var6[lVar15 + uVar19 + 0xffffffffffffffff];
            if ((uVar9 & uVar23) == 0) {
              p_Var6[lVar15 + uVar19 + 0xffffffffffffffff] = uVar9 | uVar23;
              if (1 < (this->partitionGraph_).partitions_.
                      super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[puVar8[(long)v_00]]._M_h.
                      _M_element_count) {
                local_130 = (double)puVar8[uVar7];
                local_1c8 = v_01;
                local_128 = (double)puVar8[(long)v_00];
                local_50 = dVar21;
                local_70 = PartitionGraph::move(local_1b8,(size_t)v_00,(size_t)local_130);
                dVar30 = INFINITY;
                dVar31 = INFINITY;
                dVar16 = INFINITY;
                if (ABS(local_70) != INFINITY) {
                  (*(this->super_HeuristicBase)._vptr_HeuristicBase[3])(this,local_128,local_130);
                  local_58 = extraout_XMM0_Qa_01 - this->localBranchingObjective_;
                  local_130 = extraout_XMM0_Qa_01;
                  PartitionGraph::move(local_1b8,(size_t)v_00,(size_t)local_128);
                  local_128 = this->branchingObjective_;
                  (*(this->super_HeuristicBase)._vptr_HeuristicBase[2])(this);
                  dVar31 = local_128 + local_58;
                  dVar30 = local_70 + local_58 + extraout_XMM0_Qa_02;
                  dVar16 = local_130;
                }
                v_01 = local_1c8;
                iVar24._M_current = local_78;
                dVar21 = local_50;
                if (dVar30 < local_50 + -1e-08) {
                  v_01 = v_00;
                  dVar21 = dVar30;
                  local_98 = dVar16;
                  local_90 = dVar31;
                  local_88 = uVar7;
                }
              }
            }
          }
          ppVar27 = ppVar27 + 1;
        } while (ppVar27 != iVar24._M_current);
      }
      dVar21 = ABS(dVar21);
      if (dVar21 != INFINITY) {
        local_1c8 = dVar21;
        dVar21 = PartitionGraph::move
                           (local_1b8,(size_t)v_01,
                            (this->partitionGraph_).vertexLabels_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[local_88]);
        this->internalObjective_ = dVar21 + this->internalObjective_;
        this->localBranchingObjective_ = local_98;
        this->branchingObjective_ = local_90;
        dVar21 = (double)((long)v_01 + 0x3f);
        if (-1 < (long)v_01) {
          dVar21 = v_01;
        }
        puVar1 = (this->swapped_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                 ((long)dVar21 >> 6) +
                 (ulong)(((ulong)v_01 & 0x800000000000003f) < 0x8000000000000001) +
                 0xffffffffffffffff;
        *puVar1 = *puVar1 | 1L << (SUB81(v_01,0) & 0x3f);
        (*(this->super_HeuristicBase)._vptr_HeuristicBase[2])(this);
        local_1a8 = local_1a8 + 1;
        if (extraout_XMM0_Qa_03 < local_a0 + -1e-08) {
          (*(this->super_HeuristicBase)._vptr_HeuristicBase[2])(this);
          local_48 = this->internalObjective_;
          dStack_40 = this->branchingObjective_;
          local_120._M_buckets = (__buckets_ptr)0x0;
          local_120._M_bucket_count = local_1c0->_M_bucket_count;
          local_120._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_120._M_element_count = local_1c0->_M_element_count;
          local_120._M_rehash_policy._M_max_load_factor = local_138->_M_max_load_factor;
          local_120._M_rehash_policy._4_4_ = *(undefined4 *)&local_138->field_0x4;
          local_120._M_rehash_policy._M_next_resize = local_138->_M_next_resize;
          local_120._M_single_bucket = (__node_base_ptr)0x0;
          local_1a0._M_buckets = (__buckets_ptr)&local_120;
          local_a0 = extraout_XMM0_Qa_04;
          std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&local_120,local_1c0,
                     (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_>
                      *)&local_1a0);
          local_e8 = 0;
          local_e0 = local_1b0->_M_bucket_count;
          local_d8 = 0;
          local_d0 = local_1b0->_M_element_count;
          local_c8 = *(undefined8 *)local_140;
          sStack_c0 = local_140->_M_next_resize;
          local_b8 = 0;
          local_1a0._M_buckets = (__buckets_ptr)&local_e8;
          std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_1a0._M_buckets,local_1b0,
                     (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_>
                      *)&local_1a0);
          lVar15 = 0;
          do {
            local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)&local_1a0;
            local_1a0._M_buckets = (__buckets_ptr)0x0;
            local_1a0._M_bucket_count = *(size_type *)((long)&local_120._M_bucket_count + lVar15);
            local_1a0._M_element_count = *(size_type *)((long)&local_120._M_element_count + lVar15);
            local_1a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_1a0._M_rehash_policy._0_8_ =
                 *(undefined8 *)((long)&local_120._M_rehash_policy._M_max_load_factor + lVar15);
            local_1a0._M_rehash_policy._M_next_resize =
                 *(size_t *)((long)&local_120._M_rehash_policy._M_next_resize + lVar15);
            local_1a0._M_single_bucket = (__node_base_ptr)0x0;
            std::
            _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                      ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                       (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)((long)&local_120._M_buckets + lVar15),
                       (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_>
                        *)&local_168);
            if (local_1a0._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
              puVar8 = (this->partitionGraph_).vertexLabels_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar10 = (this->bestVertexLabels_).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              _Var12._M_nxt = local_1a0._M_before_begin._M_nxt;
              do {
                puVar10[(long)_Var12._M_nxt[1]._M_nxt] = puVar8[(long)_Var12._M_nxt[1]._M_nxt];
                _Var12._M_nxt = (_Var12._M_nxt)->_M_nxt;
              } while (_Var12._M_nxt != (_Hash_node_base *)0x0);
            }
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable(&local_1a0);
            lVar15 = lVar15 + 0x38;
          } while (lVar15 != 0x70);
          lVar15 = 0x38;
          do {
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)((long)&local_120._M_buckets + lVar15));
            lVar15 = lVar15 + -0x38;
          } while (lVar15 != -0x38);
          local_148 = local_1a8;
        }
        if (iStack_1e0._M_current != local_1e8) {
          iStack_1e0._M_current = local_1e8;
        }
        for (p_Var28 = (local_1c0->_M_before_begin)._M_nxt; dVar21 = local_1c8,
            p_Var28 != (_Hash_node_base *)0x0; p_Var28 = p_Var28->_M_nxt) {
          for (p_Var17 = (local_1b0->_M_before_begin)._M_nxt; p_Var17 != (_Hash_node_base *)0x0;
              p_Var17 = p_Var17->_M_nxt) {
            p_Var2 = p_Var17[1]._M_nxt;
            pRVar4 = (((this->super_HeuristicBase).data_)->problemGraph->graph_).vertices_.
                     super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            p_Var3 = p_Var28[1]._M_nxt;
            p_Var22 = p_Var3;
            if ((ulong)((long)pRVar4[(long)p_Var2].vector_.
                              super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       *(long *)&pRVar4[(long)p_Var2].vector_) <
                (ulong)((long)pRVar4[(long)p_Var3].vector_.
                              super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       *(long *)&pRVar4[(long)p_Var3].vector_)) {
              p_Var22 = p_Var2;
              p_Var2 = p_Var3;
            }
            pAVar14 = *(pointer *)&pRVar4[(long)p_Var22].vector_;
            pAVar5 = pRVar4[(long)p_Var22].vector_.
                     super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            uVar19 = (long)pAVar5 - (long)pAVar14 >> 4;
            while (uVar23 = uVar19, 0 < (long)uVar23) {
              uVar19 = uVar23 >> 1;
              if (*(_Hash_node_base **)(pAVar14 + uVar19) < p_Var2) {
                pAVar14 = pAVar14 + uVar19 + 1;
                uVar19 = ~uVar19 + uVar23;
              }
            }
            if ((pAVar5 != pAVar14) && ((_Hash_node_base *)pAVar14->vertex_ == p_Var2)) {
              local_120._M_buckets = &(p_Var28[1]._M_nxt)->_M_nxt;
              local_120._M_bucket_count = (size_type)p_Var17[1]._M_nxt;
              if (iStack_1e0._M_current == local_1d8) {
                std::
                vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                          ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                            *)&local_1e8,iStack_1e0,(pair<unsigned_long,_unsigned_long> *)&local_120
                          );
              }
              else {
                (iStack_1e0._M_current)->first = (unsigned_long)local_120._M_buckets;
                (iStack_1e0._M_current)->second = local_120._M_bucket_count;
                iStack_1e0._M_current = iStack_1e0._M_current + 1;
              }
              local_120._M_buckets = &(p_Var17[1]._M_nxt)->_M_nxt;
              local_120._M_bucket_count = (size_type)p_Var28[1]._M_nxt;
              if (iStack_1e0._M_current == local_1d8) {
                std::
                vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                          ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                            *)&local_1e8,iStack_1e0,(pair<unsigned_long,_unsigned_long> *)&local_120
                          );
              }
              else {
                (iStack_1e0._M_current)->first = (unsigned_long)local_120._M_buckets;
                (iStack_1e0._M_current)->second = local_120._M_bucket_count;
                iStack_1e0._M_current = iStack_1e0._M_current + 1;
              }
            }
          }
        }
      }
      p_Var25 = local_1b0;
      p_Var26 = local_1c0;
    } while ((dVar21 != INFINITY) &&
            (uVar19 = local_80 + 1, bVar29 = local_80 != local_60, local_80 = uVar19, bVar29));
    applyMerge(this,local_a8,local_b0);
    (*(this->super_HeuristicBase)._vptr_HeuristicBase[2])(this);
    uVar23 = local_1a8 + 1;
    uVar19 = local_148;
    if (extraout_XMM0_Qa_05 < local_a0 + -1e-08) {
      local_1a0._M_buckets = (__buckets_ptr)&local_120;
      local_120._M_buckets = (__buckets_ptr)0x0;
      local_120._M_bucket_count = p_Var26->_M_bucket_count;
      local_120._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_120._M_element_count = p_Var26->_M_element_count;
      local_120._M_rehash_policy._M_max_load_factor = local_138->_M_max_load_factor;
      local_120._M_rehash_policy._4_4_ = *(undefined4 *)&local_138->field_0x4;
      local_120._M_rehash_policy._M_next_resize = local_138->_M_next_resize;
      local_120._M_single_bucket = (__node_base_ptr)0x0;
      local_1a8 = local_1a8 + 1;
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_1a0._M_buckets,p_Var26,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_> *)
                 &local_1a0);
      local_1a0._M_buckets = (__buckets_ptr)&local_e8;
      local_e8 = 0;
      local_e0 = p_Var25->_M_bucket_count;
      local_d8 = 0;
      local_d0 = p_Var25->_M_element_count;
      local_c8 = *(undefined8 *)local_140;
      sStack_c0 = local_140->_M_next_resize;
      local_b8 = 0;
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_1a0._M_buckets,p_Var25,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_> *)
                 &local_1a0);
      lVar15 = 0;
      do {
        local_1a0._M_buckets = (__buckets_ptr)0x0;
        local_1a0._M_bucket_count = *(size_type *)((long)&local_120._M_bucket_count + lVar15);
        local_1a0._M_element_count = *(size_type *)((long)&local_120._M_element_count + lVar15);
        local_1a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_1a0._M_rehash_policy._0_8_ =
             *(undefined8 *)((long)&local_120._M_rehash_policy._M_max_load_factor + lVar15);
        local_1a0._M_rehash_policy._M_next_resize =
             *(size_t *)((long)&local_120._M_rehash_policy._M_next_resize + lVar15);
        local_1a0._M_single_bucket = (__node_base_ptr)0x0;
        local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&local_1a0;
        std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_1a0,
                   (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)((long)&local_120._M_buckets + lVar15),
                   (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_> *)
                   &local_168);
        if (local_1a0._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
          puVar8 = (this->partitionGraph_).vertexLabels_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar10 = (this->bestVertexLabels_).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          _Var12._M_nxt = local_1a0._M_before_begin._M_nxt;
          do {
            puVar10[(long)_Var12._M_nxt[1]._M_nxt] = puVar8[(long)_Var12._M_nxt[1]._M_nxt];
            _Var12._M_nxt = (_Var12._M_nxt)->_M_nxt;
          } while (_Var12._M_nxt != (_Hash_node_base *)0x0);
        }
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&local_1a0);
        lVar15 = lVar15 + 0x38;
      } while (lVar15 != 0x70);
      lVar15 = 0x38;
      do {
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)((long)&local_120._M_buckets + lVar15));
        lVar15 = lVar15 + -0x38;
        uVar23 = local_1a8;
        p_Var26 = local_1c0;
        uVar19 = local_1a8;
      } while (lVar15 != -0x38);
    }
    if (uVar19 < uVar23) {
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                (&local_168,p_Var25->_M_element_count + p_Var26->_M_element_count);
      local_1a0._M_buckets = (__buckets_ptr)&local_120;
      local_120._M_buckets = (__buckets_ptr)0x0;
      local_120._M_bucket_count = p_Var26->_M_bucket_count;
      local_120._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_120._M_element_count = p_Var26->_M_element_count;
      local_120._M_rehash_policy._M_max_load_factor = local_138->_M_max_load_factor;
      local_120._M_rehash_policy._4_4_ = *(undefined4 *)&local_138->field_0x4;
      local_120._M_rehash_policy._M_next_resize = local_138->_M_next_resize;
      local_120._M_single_bucket = (__node_base_ptr)0x0;
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_1a0._M_buckets,p_Var26,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_> *)
                 &local_1a0);
      local_1a0._M_buckets = (__buckets_ptr)&local_e8;
      local_e8 = 0;
      local_e0 = p_Var25->_M_bucket_count;
      local_d8 = 0;
      local_d0 = p_Var25->_M_element_count;
      local_c8 = *(undefined8 *)local_140;
      sStack_c0 = local_140->_M_next_resize;
      local_b8 = 0;
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_1a0._M_buckets,p_Var25,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_> *)
                 &local_1a0);
      lVar15 = 0;
      local_148 = uVar19;
      do {
        local_68._M_h = (__hashtable_alloc *)&local_1a0;
        local_1a0._M_buckets = (__buckets_ptr)0x0;
        local_1a0._M_bucket_count = *(size_type *)((long)&local_120._M_bucket_count + lVar15);
        local_1a0._M_element_count = *(size_type *)((long)&local_120._M_element_count + lVar15);
        local_1a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_1a0._M_rehash_policy._0_8_ =
             *(undefined8 *)((long)&local_120._M_rehash_policy._M_max_load_factor + lVar15);
        local_1a0._M_rehash_policy._M_next_resize =
             *(size_t *)((long)&local_120._M_rehash_policy._M_next_resize + lVar15);
        local_1a0._M_single_bucket = (__node_base_ptr)0x0;
        std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_68._M_h,
                   (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)((long)&local_120._M_buckets + lVar15),&local_68);
        for (_Var12._M_nxt = local_1a0._M_before_begin._M_nxt;
            _Var12._M_nxt != (_Hash_node_base *)0x0; _Var12._M_nxt = (_Var12._M_nxt)->_M_nxt) {
          local_68._M_h = (__hashtable_alloc *)_Var12._M_nxt[1]._M_nxt;
          if ((this->bestVertexLabels_).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[(long)local_68._M_h] !=
              (this->partitionGraph_).vertexLabels_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[(long)local_68._M_h]) {
            if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_168,
                         (iterator)
                         local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_68);
            }
            else {
              *local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish = (unsigned_long)local_68._M_h;
              local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
        }
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&local_1a0);
        lVar15 = lVar15 + 0x38;
      } while (lVar15 != 0x70);
      lVar15 = 0x38;
      do {
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)((long)&local_120._M_buckets + lVar15));
        puVar8 = local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        lVar15 = lVar15 + -0x38;
        p_Var26 = (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      } while (lVar15 != -0x38);
      for (; p_Var26 !=
             (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)puVar8;
          p_Var26 = (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&p_Var26->_M_bucket_count) {
        PartitionGraph::forceMove
                  (local_1b8,(size_t)p_Var26->_M_buckets,
                   (this->bestVertexLabels_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)p_Var26->_M_buckets]);
      }
      PartitionGraph::updateEdgesOfPartition(local_1b8,local_a8);
      uVar19 = local_148;
      PartitionGraph::updateEdgesOfPartition(local_1b8,local_b0);
      this->internalObjective_ = local_48;
      this->branchingObjective_ = dStack_40;
      if ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           *)local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start !=
          (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           *)0x0) {
        operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_168.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  if (local_1e8 != (pair<unsigned_long,_unsigned_long> *)0x0) {
    operator_delete(local_1e8,(long)local_1d8 - (long)local_1e8);
  }
  return uVar19;
}

Assistant:

inline size_t
PartitionOptimizerBase<BROPT>::improveBipartition(size_t partitionIdA,
                                                  size_t partitionIdB)
{
    size_t numberOfMoves = 0;

    size_t bestNumberOfMoves = 0;
    auto bestObjective = getObjective();
    auto bestInternalObjective = internalObjective_;
    auto bestBranchingObjective = branchingObjective_;

    auto& partitionA = partitionGraph_.partitions_[partitionIdA];
    auto& partitionB = partitionGraph_.partitions_[partitionIdB];

    // find moves.
    std::vector<std::pair<size_t, size_t>> move_edges;
    for (const auto v : partitionA) {
        for (const auto w : partitionB) {

            if (this->data_.problemGraph.graph().findEdge(v, w).first) {
                move_edges.emplace_back(std::make_pair(v, w));
                move_edges.emplace_back(std::make_pair(w, v));
            }
        }
    }

    if (move_edges.empty()) {
        return 0;
    }

    // mark nodes as available for swapping.
    for (const auto& partition : { partitionA, partitionB }) {
        for (const auto& v : partition) {
            swapped_[v] = false;
        }
    }

    // start greedy search for improving moves
    localBranchingObjective_ =
        getBaselineBranchingObjective(partitionIdA, partitionIdB);

    const size_t maxMoves =
        calcMaximumMoves(partitionA.size(), partitionB.size());
    for (size_t iter = 0; iter < maxMoves + 1; ++iter) {

        Move best;

        // reset visits.
        for (const auto& partition : { partitionA, partitionB }) {
            for (const auto& v : partition) {
                visited_[v] = false;
            }
        }

        for (const auto& vw : move_edges) {

            const auto v = vw.first;
            const auto w = vw.second;

            // /* Debug
            if (partitionGraph_.vertexLabels_[v] ==
                partitionGraph_.vertexLabels_[w]) {
                std::cerr << v << "(" << partitionGraph_.vertexLabels_[v] << ")"
                          << std::endl;
                std::cerr << w << "(" << partitionGraph_.vertexLabels_[w] << ")"
                          << std::endl;
                throw std::runtime_error(
                    "vertexLabels_ and partitions_ are inconsistent!");
            }
            // */

            // prevent swapping back and forth
            if (swapped_[v] || visited_[v]) {
                continue;
            }
            visited_[v] = true;

            // dont let partitions vanish.
            // This case is handled by a complete merge.
            if (partitionGraph_.partitions_[partitionGraph_.vertexLabels_[v]]
                    .size() <= 1) {
                continue;
            }

            const auto move = proposeSingleMove(v, w);
            if (lowerThanWithEpsilon(best.obj_, move.obj_)) {
                best = move;
            }
        }

        // if no move was feasible, then stop searching for moves.
        if (std::isinf(best.obj_)) {
            break;

        } else {
            applySingleMove(best.vertex_,
                            partitionGraph_.vertexLabels_[best.other_]);
            localBranchingObjective_ = best.localBranchingObj_;
            branchingObjective_ = best.branchingObj_;
            swapped_[best.vertex_] = true;
            ++numberOfMoves;

            // keep track of the best labeling.
            if (lowerThanWithEpsilon(bestObjective, getObjective())) {

                bestObjective = getObjective();
                bestNumberOfMoves = numberOfMoves;
                bestInternalObjective = internalObjective_;
                bestBranchingObjective = branchingObjective_;

                // update best vertex labeling.
                for (auto partition : { partitionA, partitionB }) {
                    for (auto v : partition) {
                        bestVertexLabels_[v] = partitionGraph_.vertexLabels_[v];
                    }
                }
            }
        }

        // search new feasible moves.
        move_edges.clear();
        for (const auto& v : partitionA) {
            for (const auto& w : partitionB) {

                if (this->data_.problemGraph.graph().findEdge(v, w).first) {
                    move_edges.emplace_back(std::make_pair(v, w));
                    move_edges.emplace_back(std::make_pair(w, v));
                }
            }
        }
    }

    // Would a merge be better?
    {
        applyMerge(partitionIdA, partitionIdB);
        ++numberOfMoves;

        if (lowerThanWithEpsilon(bestObjective, getObjective())) {

            bestNumberOfMoves = numberOfMoves;

            // update best vertex labeling.
            for (auto partition : { partitionA, partitionB }) {
                for (auto v : partition) {
                    bestVertexLabels_[v] = partitionGraph_.vertexLabels_[v];
                }
            }
        }
    }

    // revert to best labeling.
    if (numberOfMoves > bestNumberOfMoves) {

        std::vector<size_t> buffer;
        buffer.reserve(partitionA.size() + partitionB.size());

        for (auto partition : { partitionA, partitionB }) {
            for (auto v : partition) {
                if (bestVertexLabels_[v] != partitionGraph_.vertexLabels_[v]) {
                    buffer.push_back(v);
                }
            }
        }

        // revert partitions and labels.
        for (const auto& v : buffer) {
            partitionGraph_.forceMove(v, bestVertexLabels_[v]);
        }

        // update branching edges.
        partitionGraph_.updateEdgesOfPartition(partitionIdA);
        partitionGraph_.updateEdgesOfPartition(partitionIdB);

        // and revert partial objectives.
        internalObjective_ = bestInternalObjective;
        branchingObjective_ = bestBranchingObjective;
    }

    // assert(std::abs(getObjective() - bestObjective) < EPSILON);

    return bestNumberOfMoves;
}